

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

cmValue __thiscall cmStateSnapshot::GetDefinition(cmStateSnapshot *this,string *name)

{
  StackIter begin;
  StackIter end;
  bool bVar1;
  PointerType pSVar2;
  cmValue cVar3;
  PositionType *this_00;
  
  this_00 = &this->Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar2->Vars);
  if (bVar1) {
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    begin.Tree = (pSVar2->Vars).Tree;
    begin.Position = (pSVar2->Vars).Position;
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    end.Tree = (pSVar2->Root).Tree;
    end.Position = (pSVar2->Root).Position;
    cVar3 = cmDefinitions::Get(name,begin,end);
    return (cmValue)cVar3.Value;
  }
  __assert_fail("this->Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmStateSnapshot.cxx"
                ,0xd3,"cmValue cmStateSnapshot::GetDefinition(const std::string &) const");
}

Assistant:

cmValue cmStateSnapshot::GetDefinition(std::string const& name) const
{
  assert(this->Position->Vars.IsValid());
  return cmDefinitions::Get(name, this->Position->Vars, this->Position->Root);
}